

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O3

bool crnd::crnd_get_level_info
               (void *pData,uint32 data_size,uint32 level_index,crn_level_info *pLevel_info)

{
  uchar uVar1;
  ushort uVar2;
  crn_header *pcVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  
  if (((((pLevel_info != (crn_level_info *)0x0 && pData != (void *)0x0) && 0x3d < data_size) &&
       (*(int *)pLevel_info == 0x28)) &&
      (pcVar3 = crnd_get_header(pData,data_size), pcVar3 != (crn_header *)0x0)) &&
     (level_index < (pcVar3->m_levels).m_buf[0])) {
    uVar2 = *(ushort *)(pcVar3->m_width).m_buf;
    uVar4 = (uint)((ushort)(uVar2 << 8 | uVar2 >> 8) >> ((byte)level_index & 0x1f));
    iVar5 = uVar4 + (uVar4 == 0);
    uVar2 = *(ushort *)(pcVar3->m_height).m_buf;
    uVar4 = (uint)((ushort)(uVar2 << 8 | uVar2 >> 8) >> ((byte)level_index & 0x1f));
    iVar6 = uVar4 + (uVar4 == 0);
    *(int *)(pLevel_info + 4) = iVar5;
    *(int *)(pLevel_info + 8) = iVar6;
    *(uint *)(pLevel_info + 0xc) = (uint)(pcVar3->m_faces).m_buf[0];
    *(uint *)(pLevel_info + 0x10) = iVar5 + 3U >> 2;
    *(uint *)(pLevel_info + 0x14) = iVar6 + 3U >> 2;
    uVar1 = (pcVar3->m_format).m_buf[0];
    iVar5 = 8;
    if (uVar1 != '\0') {
      iVar5 = (uint)(uVar1 != '\t') * 8 + 8;
    }
    *(int *)(pLevel_info + 0x18) = iVar5;
    *(ulong *)(pLevel_info + 0x20) = (ulong)(pcVar3->m_format).m_buf[0];
    return true;
  }
  return false;
}

Assistant:

bool crnd_get_level_info(const void* pData, uint32 data_size, uint32 level_index, crn_level_info* pLevel_info) {
  if ((!pData) || (data_size < cCRNHeaderMinSize) || (!pLevel_info))
    return false;

  if (pLevel_info->m_struct_size != sizeof(crn_level_info))
    return false;

  const crn_header* pHeader = crnd_get_header(pData, data_size);
  if (!pHeader)
    return false;

  if (level_index >= pHeader->m_levels)
    return false;

  uint32 width = math::maximum<uint32>(1U, pHeader->m_width >> level_index);
  uint32 height = math::maximum<uint32>(1U, pHeader->m_height >> level_index);

  pLevel_info->m_width = width;
  pLevel_info->m_height = height;
  pLevel_info->m_faces = pHeader->m_faces;
  pLevel_info->m_blocks_x = (width + 3) >> 2;
  pLevel_info->m_blocks_y = (height + 3) >> 2;
  pLevel_info->m_bytes_per_block = ((pHeader->m_format == cCRNFmtDXT1) || (pHeader->m_format == cCRNFmtDXT5A)) ? 8 : 16;
  pLevel_info->m_format = static_cast<crn_format>((uint32)pHeader->m_format);

  return true;
}